

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O2

void __thiscall leveldb::TableBuilder::Add(TableBuilder *this,Slice *key,Slice *value)

{
  Rep *pRVar1;
  Comparator *pCVar2;
  uint __line;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *__assertion;
  string handle_encoding;
  Slice local_48;
  Slice local_38;
  
  pRVar1 = this->rep_;
  if (pRVar1->closed == true) {
    __assertion = "!r->closed";
    __line = 0x60;
LAB_00118b35:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                  ,__line,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
  }
  bVar3 = ok(this);
  if (bVar3) {
    if (0 < pRVar1->num_entries) {
      pCVar2 = (pRVar1->options).comparator;
      handle_encoding._M_dataplus._M_p = (pRVar1->last_key)._M_dataplus._M_p;
      handle_encoding._M_string_length = (pRVar1->last_key)._M_string_length;
      iVar4 = (*pCVar2->_vptr_Comparator[2])(pCVar2,key);
      if (iVar4 < 1) {
        __assertion = "r->options.comparator->Compare(key, Slice(r->last_key)) > 0";
        __line = 99;
        goto LAB_00118b35;
      }
    }
    if (pRVar1->pending_index_entry == true) {
      if ((pRVar1->data_block).buffer_._M_string_length != 0) {
        __assertion = "r->data_block.empty()";
        __line = 0x67;
        goto LAB_00118b35;
      }
      pCVar2 = (pRVar1->options).comparator;
      (*pCVar2->_vptr_Comparator[4])(pCVar2,&pRVar1->last_key,key);
      handle_encoding._M_dataplus._M_p = (pointer)&handle_encoding.field_2;
      handle_encoding._M_string_length = 0;
      handle_encoding.field_2._M_local_buf[0] = '\0';
      BlockHandle::EncodeTo(&pRVar1->pending_handle,&handle_encoding);
      local_38.data_ = (pRVar1->last_key)._M_dataplus._M_p;
      local_38.size_ = (pRVar1->last_key)._M_string_length;
      local_48.data_ = handle_encoding._M_dataplus._M_p;
      local_48.size_ = handle_encoding._M_string_length;
      BlockBuilder::Add(&pRVar1->index_block,&local_38,&local_48);
      pRVar1->pending_index_entry = false;
      std::__cxx11::string::~string((string *)&handle_encoding);
    }
    if (pRVar1->filter_block != (FilterBlockBuilder *)0x0) {
      FilterBlockBuilder::AddKey(pRVar1->filter_block,key);
    }
    std::__cxx11::string::assign((char *)&pRVar1->last_key,(ulong)key->data_);
    pRVar1->num_entries = pRVar1->num_entries + 1;
    BlockBuilder::Add(&pRVar1->data_block,key,value);
    sVar5 = BlockBuilder::CurrentSizeEstimate(&pRVar1->data_block);
    if ((pRVar1->options).block_size <= sVar5) {
      Flush(this);
    }
  }
  return;
}

Assistant:

void TableBuilder::Add(const Slice& key, const Slice& value) {
  Rep* r = rep_;
  assert(!r->closed);
  if (!ok()) return;
  if (r->num_entries > 0) {
    assert(r->options.comparator->Compare(key, Slice(r->last_key)) > 0);
  }

  if (r->pending_index_entry) {
    assert(r->data_block.empty());
    r->options.comparator->FindShortestSeparator(&r->last_key, key);
    std::string handle_encoding;
    r->pending_handle.EncodeTo(&handle_encoding);
    r->index_block.Add(r->last_key, Slice(handle_encoding));
    r->pending_index_entry = false;
  }

  if (r->filter_block != nullptr) {
    r->filter_block->AddKey(key);
  }

  r->last_key.assign(key.data(), key.size());
  r->num_entries++;
  r->data_block.Add(key, value);

  const size_t estimated_block_size = r->data_block.CurrentSizeEstimate();
  if (estimated_block_size >= r->options.block_size) {
    Flush();
  }
}